

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

uint64 __thiscall
xLearn::Parser::get_line_from_buffer(Parser *this,char *line,char *buf,uint64 pos,uint64 size)

{
  ostream *poVar1;
  string *in_RCX;
  long in_RDX;
  void *in_RSI;
  string *in_R8;
  bool bVar2;
  uint64 read_size;
  uint64 end_pos;
  allocator *this_00;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string *in_stack_ffffffffffffffb8;
  string *file;
  LogSeverity severity;
  uint64 local_8;
  
  file = in_RCX;
  if (in_RCX < in_R8) {
    while( true ) {
      bVar2 = false;
      if (file < in_R8) {
        bVar2 = (&file->_M_dataplus)[in_RDX] != (_Alloc_hider)0xa;
      }
      if (!bVar2) break;
      file = (string *)&file->field_0x1;
    }
    local_8 = (long)file + (1 - (long)in_RCX);
    if (0xa00000 < local_8) {
      Logger::Logger((Logger *)&stack0xffffffffffffffbc,FATAL);
      severity = (LogSeverity)((ulong)in_R8 >> 0x20);
      this_00 = &local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
                 ,this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"get_line_from_buffer",&local_a1);
      poVar1 = Logger::Start(severity,file,(int)(local_8 >> 0x20),in_stack_ffffffffffffffb8);
      std::operator<<(poVar1,
                      "Encountered a too-long line.                       Please check the data.");
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      Logger::~Logger((Logger *)this_00);
    }
    memcpy(in_RSI,&in_RCX->_M_dataplus + in_RDX,local_8);
    *(undefined1 *)((long)in_RSI + (local_8 - 1)) = 0;
    if ((1 < local_8) && (*(char *)((long)in_RSI + (local_8 - 2)) == '\r')) {
      *(undefined1 *)((long)in_RSI + (local_8 - 2)) = 0;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64 Parser::get_line_from_buffer(char* line,
                                    char* buf,
                                    uint64 pos,
                                    uint64 size) {
  if (pos >= size) { return 0; }
  uint64 end_pos = pos;
  while (end_pos < size && buf[end_pos] != '\n') { end_pos++; }
  uint64 read_size = end_pos - pos + 1;
  if (read_size > kMaxLineSize) {
    LOG(FATAL) << "Encountered a too-long line.    \
                   Please check the data.";
  }
  memcpy(line, buf+pos, read_size);
  line[read_size - 1] = '\0';
  if (read_size > 1 && line[read_size - 2] == '\r') {
    // Handle some txt format in windows or DOS.
    line[read_size - 2] = '\0';
  }
  return read_size;
}